

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

ctmbstr prvTidygetNextOptionPick(TidyOptionImpl *option,TidyIterator *iter)

{
  PickListItems *paPVar1;
  ctmbstr ptVar2;
  TidyIterator p_Var3;
  
  if ((option == (TidyOptionImpl *)0x0) || (iter == (TidyIterator *)0x0)) {
    __assert_fail("option!=NULL && iter != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/config.c"
                  ,0x726,"ctmbstr prvTidygetNextOptionPick(const TidyOptionImpl *, TidyIterator *)")
    ;
  }
  paPVar1 = option->pickList;
  if (paPVar1 == (PickListItems *)0x0) {
    return (ctmbstr)0x0;
  }
  p_Var3 = *iter;
  if (p_Var3 < (TidyIterator)0x10 && p_Var3 != (TidyIterator)0x0) {
    ptVar2 = paPVar1[-1][(long)((long)&p_Var3[3]._opaque + 3)].label;
    if (ptVar2 == (ctmbstr)0x0) goto LAB_0014c03c;
    if ((*paPVar1)[(long)p_Var3].label != (ctmbstr)0x0) {
      p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
      goto LAB_0014c040;
    }
  }
  else {
LAB_0014c03c:
    ptVar2 = (ctmbstr)0x0;
  }
  p_Var3 = (TidyIterator)0x0;
LAB_0014c040:
  *iter = p_Var3;
  return ptVar2;
}

Assistant:

ctmbstr      TY_(getNextOptionPick)( const TidyOptionImpl* option,
                                     TidyIterator* iter )
{
    size_t ix;
    ctmbstr val = NULL;
    const PickListItem *item= NULL;
    assert( option!=NULL && iter != NULL );

    ix = (size_t) *iter;
    
    if ( option->pickList )
    {
        if ( ix > 0 && ix < TIDY_PL_SIZE && option->pickList )
        {
            item = &(*option->pickList)[ ix-1 ];
            val = item->label;
        }
        item = &(*option->pickList)[ ix ];
        *iter = (TidyIterator) ( val && item->label ? ix + 1 : (size_t)0 );
    }
    
    return val;
}